

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVectorBase<char>::resizeRealloc<slang::SmallVectorBase<char>::ValueInitTag>
          (SmallVectorBase<char> *this,size_type newSize,ValueInitTag *val)

{
  size_type sVar1;
  size_type capacity;
  char *__result;
  iterator __first;
  iterator __last;
  EVP_PKEY_CTX *ctx;
  pointer newData;
  size_type newCap;
  ValueInitTag *val_local;
  size_type newSize_local;
  SmallVectorBase<char> *this_local;
  
  if (newSize <= this->len) {
    assert::assertFailed
              ("newSize > len",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
               ,0x337,
               "void slang::SmallVectorBase<char>::resizeRealloc(size_type, const TVal &) [T = char, TVal = slang::SmallVectorBase<char>::ValueInitTag]"
              );
  }
  sVar1 = max_size(this);
  if (sVar1 < newSize) {
    slang::detail::throwLengthError();
  }
  capacity = calculateGrowth(this,newSize);
  __result = (char *)slang::detail::allocArray(capacity,1);
  __first = begin(this);
  __last = end(this);
  std::uninitialized_move<char*,char*>(__first,__last,__result);
  ctx = (EVP_PKEY_CTX *)(newSize - this->len);
  std::uninitialized_value_construct_n<char*,unsigned_long>(__result + this->len,(unsigned_long)ctx)
  ;
  cleanup(this,ctx);
  this->len = newSize;
  this->cap = capacity;
  this->data_ = __result;
  return;
}

Assistant:

void SmallVectorBase<T>::resizeRealloc(size_type newSize, const TVal& val) {
    ASSERT(newSize > len);
    if (newSize > max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(newSize);
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    std::uninitialized_move(begin(), end(), newData);

    if constexpr (std::is_same_v<T, TVal>) {
        std::uninitialized_fill_n(newData + len, newSize - len, val);
    }
    else {
        std::uninitialized_value_construct_n(newData + len, newSize - len);
    }

    cleanup();
    len = newSize;
    cap = newCap;
    data_ = newData;
}